

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall
CVmObjBigNum::getp_cos(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  char *pcVar2;
  char *pcVar3;
  err_frame_t *peVar4;
  CVmException *pCVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  CVmObjBigNum *pCVar9;
  size_t prec;
  long *in_FS_OFFSET;
  char *ext1;
  char *ext7;
  char *ext2;
  char *ext6;
  uint hdl7;
  uint hdl6;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *ext5;
  char *ext4;
  char *ext3;
  char *new_ext;
  char *local_118;
  err_frame_t err_cur__;
  
  uVar1 = *(ushort *)(this->super_CVmObject).ext_;
  iVar6 = setup_getp_0(this,self,retval,argc,&new_ext);
  if (iVar6 == 0) {
    prec = (ulong)uVar1 + 3;
    local_118 = cache_pi(prec);
    alloc_temp_regs(prec,7,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4,&ext5,&hdl5,&ext6,&hdl6,
                    &ext7,&hdl7);
    G_err_frame::__tls_init();
    err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    pcVar3 = local_118;
    if (err_cur__.state_ == 0) {
      copy_val(ext1,(this->super_CVmObject).ext_,0);
      ext1[4] = ext1[4] & 0xfe;
      copy_val(ext7,pcVar3,1);
      mul_by_long(ext7,2);
      while (iVar6 = compare_abs(ext1,ext7), 0 < iVar6) {
        compute_quotient_into(ext6,ext2,ext1,ext7);
        pcVar2 = ext1;
        ext1 = ext2;
        ext2 = pcVar2;
      }
      copy_val(ext7,pcVar3,1);
      iVar6 = compare_abs(ext1,ext7);
      bVar8 = 0 < iVar6;
      if (bVar8) {
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar2 = ext1;
        ext1 = ext2;
        ext2 = pcVar2;
      }
      div_by_long(ext7,2,(unsigned_long *)0x0);
      iVar7 = compare_abs(ext1,ext7);
      if (0 < iVar7) {
        bVar8 = iVar6 < 1;
        copy_val(ext7,pcVar3,1);
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar2 = ext1;
        ext1 = ext2;
        ext2 = pcVar2;
      }
      ext1[4] = ext1[4] & 0xfe;
      copy_val(ext7,pcVar3,1);
      div_by_long(ext7,4,(unsigned_long *)0x0);
      pCVar9 = (CVmObjBigNum *)ext1;
      iVar6 = compare_abs(ext1,ext7);
      if (iVar6 < 1) {
        calc_cos_series(pCVar9,new_ext,ext1,ext2,ext3,ext4,ext5,ext6,ext7);
      }
      else {
        copy_val(ext7,pcVar3,1);
        div_by_long(ext7,2,(unsigned_long *)0x0);
        pCVar9 = (CVmObjBigNum *)ext2;
        compute_abs_diff_into(ext2,ext1,ext7);
        pcVar2 = ext2;
        pcVar3 = ext1;
        bVar8 = (bool)((bVar8 == false ^ ext1[4]) & 1);
        ext1[4] = ext1[4] & 0xfe;
        ext1 = ext2;
        ext2 = pcVar3;
        calc_sin_series(pCVar9,new_ext,pcVar2,pcVar3,ext3,ext4,ext5,ext6,ext7);
      }
      if (bVar8 != false) {
        new_ext[4] = new_ext[4] ^ 1;
      }
      normalize(new_ext);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      release_temp_regs(7,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4,(ulong)hdl5,(ulong)hdl6,
                        (ulong)hdl7);
    }
    peVar4 = err_cur__.prv_;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)peVar4;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pCVar5 = err_cur__.exc_;
      G_err_frame::__tls_init();
      *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar5;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_cos(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3, hdl4, hdl5, hdl6, hdl7;
    char *ext1, *ext2, *ext3, *ext4, *ext5, *ext6, *ext7;
    int neg_result;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi to our working precision */
    pi = cache_pi(prec + 3);

    /* allocate our temporary registers, as per sin() */
    alloc_temp_regs(prec + 3, 7,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5, &ext6, &hdl6, &ext7, &hdl7);

    /* protect against errors so we definitely free the registers */
    err_try
    {
        char *tmp;

        /* presume the result sign will be correct */
        neg_result = FALSE;

        /* copy our initial value to ext1 */
        copy_val(ext1, ext_, FALSE);

        /* note that cos(-x) = cos(x) - if x < 0, use -x */
        set_neg(ext1, FALSE);

        /* reduce the argument modulo 2*pi */
        copy_val(ext7, pi, TRUE);
        mul_by_long(ext7, 2);
        while (compare_abs(ext1, ext7) > 0)
        {
            /* divide by 2*pi, storing the remainder in r2 */
            compute_quotient_into(ext6, ext2, ext1, ext7);

            /* swap r2 into r1 for the next round */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /* 
         *   Next, note that cos(x+pi) = -cos(x).  If x > pi, negate the
         *   result (again if necessary) and reduce the argument by pi.
         *   This will reduce our range to 0 <= x <= pi.  
         */
        copy_val(ext7, pi, TRUE);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* negate the result */
            neg_result = !neg_result;

            /* subtract pi from the argument */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   Use the fact that cos(x + pi) = -cos(x) once again: if x >
         *   pi/2, subtract pi from x to adjust the range to -pi/2 <= x <=
         *   pi/2.  
         */
        div_by_long(ext7, 2);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* negate the result */
            neg_result = !neg_result;

            /* subtract pi from the argument */
            copy_val(ext7, pi, TRUE);
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   once again, reduce our range using the sign equivalence -
         *   this will limit our range to 0 <= x <= pi/2 
         */
        set_neg(ext1, FALSE);

        /*
         *   Next, observe that cos(x+pi/2) = -sin(x).  If x > pi/4,
         *   calculate using the sine series instead of the cosine series.
         */
        copy_val(ext7, pi, TRUE);
        div_by_long(ext7, 4);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* negate the result */
            neg_result = !neg_result;
            
            /* calculate pi/2 */
            copy_val(ext7, pi, TRUE);
            div_by_long(ext7, 2);
            
            /* 
             *   subtract pi/2 - this will give us a value in the range
             *   -pi/4 <= x <= pi/4 
             */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* sin(-x) = -sin(x) */
            if (get_neg(ext1))
                neg_result = !neg_result;
            set_neg(ext1, FALSE);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;

            /* calculate the sine series */
            calc_sin_series(vmg_ new_ext,
                            ext1, ext2, ext3, ext4, ext5, ext6, ext7);
        }
        else
        {
            /*
             *   We now have a value in the range 0 <= x <= pi/4, which
             *   will converge quickly with our Taylor series 
             */
            calc_cos_series(vmg_ new_ext,
                            ext1, ext2, ext3, ext4, ext5, ext6, ext7);
        }

        /* negate the result if necessary */
        if (neg_result)
            set_neg(new_ext, !get_neg(new_ext));

        /* normalize the result */
        normalize(new_ext);
    }